

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void __thiscall ArgsManager::ClearPathCache(ArgsManager *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  unique_lock<std::recursive_mutex> local_58;
  path local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_owns = false;
  local_58._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_58);
  local_48._M_pathname.field_2._M_allocated_capacity = 0;
  local_48._M_pathname.field_2._8_8_ = 0;
  local_48._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_48._M_pathname._M_string_length = 0;
  local_48._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_48);
  if (&local_48 != &(this->m_cached_datadir_path).super_path) {
    ClearPathCache();
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  local_48._M_pathname.field_2._M_allocated_capacity = 0;
  local_48._M_pathname.field_2._8_8_ = 0;
  local_48._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_48._M_pathname._M_string_length = 0;
  local_48._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_48);
  if (&local_48 != &(this->m_cached_network_datadir_path).super_path) {
    ClearPathCache();
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  local_48._M_pathname.field_2._M_allocated_capacity = 0;
  local_48._M_pathname.field_2._8_8_ = 0;
  local_48._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_48._M_pathname._M_string_length = 0;
  local_48._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_48);
  if (&local_48 != &(this->m_cached_blocks_path).super_path) {
    ClearPathCache();
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::ClearPathCache()
{
    LOCK(cs_args);

    m_cached_datadir_path = fs::path();
    m_cached_network_datadir_path = fs::path();
    m_cached_blocks_path = fs::path();
}